

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildInt1Float1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  RegOpnd *this_00;
  RegOpnd *this_01;
  Instr *pIVar3;
  RegOpnd *this_02;
  undefined4 *puVar4;
  IRType IVar5;
  undefined6 in_register_00000032;
  OpCode opcode;
  int iVar6;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyFloat32);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x108);
  iVar6 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar6 < 0x10d) {
    if (iVar6 == 0x2e) {
      this_02 = BuildDstOpnd(this,dstRegSlot,TyInt32);
      opcode = Reinterpret_Prim;
      goto LAB_004f8bf3;
    }
    if (iVar6 == 0x33) {
      IVar5 = TyInt32;
    }
    else {
      if (iVar6 != 0x35) goto LAB_004f8b5d;
      IVar5 = TyUint32;
    }
    this_02 = BuildDstOpnd(this,dstRegSlot,IVar5);
    opcode = Conv_Prim;
    goto LAB_004f8bf3;
  }
  if (iVar6 < 0x115) {
    if ((iVar6 == 0x10d) || (iVar6 == 0x10f)) {
      this_01 = IR::RegOpnd::New(TyFloat32,this->m_func);
      IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x108);
      pIVar3 = IR::Instr::New(TrapIfTruncOverflow,&this_01->super_Opnd,&this_00->super_Opnd,
                              this->m_func);
      AddInstr(this,pIVar3,offset);
      this_02 = BuildDstOpnd(this,dstRegSlot,(newOpcode != Conv_Check_FTI) * '\x04' + TyInt32);
      this_02->field_0x18 = this_02->field_0x18 | 4;
      opcode = Conv_Prim;
      this_00 = this_01;
      goto LAB_004f8bf3;
    }
LAB_004f8b5d:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x862,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    opcode = Nop;
    this_02 = (RegOpnd *)0x0;
  }
  else {
    if (iVar6 == 0x115) {
      IVar5 = TyInt32;
    }
    else {
      if (iVar6 != 0x117) goto LAB_004f8b5d;
      IVar5 = TyUint32;
    }
    this_02 = BuildDstOpnd(this,dstRegSlot,IVar5);
    opcode = Conv_Prim_Sat;
  }
LAB_004f8bf3:
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_02->super_Opnd,valueType);
  pIVar3 = IR::Instr::New(opcode,&this_02->super_Opnd,&this_00->super_Opnd,this->m_func);
  AddInstr(this,pIVar3,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Float1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat32);
    srcOpnd->SetValueType(ValueType::Float);
    IR::RegOpnd * dstOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Nop;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_FTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Reinterpret_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Reinterpret_Prim;
        break;

    case Js::OpCodeAsmJs::Conv_Check_FTI:
    case Js::OpCodeAsmJs::Conv_Check_FTU:
    {
        IR::RegOpnd* tmpDst = IR::RegOpnd::New(TyFloat32, m_func);
        tmpDst->SetValueType(ValueType::Float);
        AddInstr(IR::Instr::New(Js::OpCode::TrapIfTruncOverflow, tmpDst, srcOpnd, m_func), offset);
        dstOpnd = BuildDstOpnd(dstRegSlot, newOpcode == Js::OpCodeAsmJs::Conv_Check_FTI ? TyInt32 : TyUint32);
        dstOpnd->m_dontDeadStore = true;
        srcOpnd = tmpDst;
        op = Js::OpCode::Conv_Prim;
        break;
    }
    default:
        Assume(UNREACHED);
    }
    dstOpnd->SetValueType(ValueType::GetInt(false));
    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}